

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O1

void __thiscall Args::GroupIface::checkCorrectnessAfterParsing(GroupIface *this)

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  logic_error *this_00;
  long *plVar4;
  ulong *puVar5;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *arg;
  pointer puVar6;
  ulong *local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  puVar1 = (this->m_children).
           super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (this->m_children).
                super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1) {
    (*((puVar6->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
       ._M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
       super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[0x11])();
  }
  iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[5])(this);
  if ((char)iVar3 != '\0') {
    iVar3 = (*(this->super_ArgIface)._vptr_ArgIface[6])(this);
    if ((char)iVar3 == '\0') {
      this_00 = (logic_error *)__cxa_allocate_exception(0x30);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Not defined required argument \"","");
      (*(this->super_ArgIface)._vptr_ArgIface[3])(&local_68,this);
      std::operator+(&local_48,&local_88,&local_68);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_a8 = (ulong *)*plVar4;
      puVar5 = (ulong *)(plVar4 + 2);
      if (local_a8 == puVar5) {
        local_98 = *puVar5;
        uStack_90 = plVar4[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar5;
      }
      lVar2 = plVar4[1];
      *plVar4 = (long)puVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
      *(undefined ***)this_00 = &PTR__BaseException_001399b8;
      *(logic_error **)(this_00 + 0x10) = this_00 + 0x20;
      if (local_a8 == &local_98) {
        *(undefined4 *)(this_00 + 0x20) = (undefined4)local_98;
        *(undefined4 *)(this_00 + 0x24) = local_98._4_4_;
        *(undefined4 *)(this_00 + 0x28) = (undefined4)uStack_90;
        *(undefined4 *)(this_00 + 0x2c) = uStack_90._4_4_;
      }
      else {
        *(ulong **)(this_00 + 0x10) = local_a8;
        *(ulong *)(this_00 + 0x20) = local_98;
      }
      *(long *)(this_00 + 0x18) = lVar2;
      local_98 = local_98 & 0xffffffffffffff00;
      __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
    }
  }
  return;
}

Assistant:

void checkCorrectnessAfterParsing() const override
	{
		for( const auto & arg : details::asConst( m_children ) )
			arg->checkCorrectnessAfterParsing();

		if( isRequired() && !isDefined() )
			throw BaseException(
				String( SL( "Not defined required argument \"" ) ) +
				name() + SL( "\"" ) );
	}